

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O0

void merged_2v_upsample(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION *in_row_group_ctr,
                       JDIMENSION in_row_groups_avail,JSAMPARRAY output_buf,JDIMENSION *out_row_ctr,
                       JDIMENSION out_rows_avail)

{
  undefined4 in_ECX;
  int *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  long in_R8;
  JSAMPARRAY in_R9;
  JDIMENSION size;
  JDIMENSION num_rows;
  JSAMPROW work_ptrs [2];
  my_merged_upsample_ptr upsample;
  uint local_4c;
  undefined8 local_48;
  undefined8 in_stack_ffffffffffffffc0;
  long lVar1;
  undefined4 in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_RDI + 0x260);
  if (*(int *)(lVar1 + 0x48) == 0) {
    local_4c = 2;
    if (*(uint *)(lVar1 + 0x50) < 2) {
      local_4c = *(uint *)(lVar1 + 0x50);
    }
    if (size - *(int *)in_R9 < local_4c) {
      local_4c = size - *(int *)in_R9;
    }
    local_48 = *(undefined8 *)(in_R8 + (ulong)*(uint *)in_R9 * 8);
    if (local_4c < 2) {
      *(undefined4 *)(lVar1 + 0x48) = 1;
    }
    (**(code **)(lVar1 + 0x18))(in_RDI,in_RSI,*in_RDX,&local_48);
  }
  else {
    jcopy_sample_rows((JSAMPARRAY)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                      (int)((ulong)in_R8 >> 0x20),in_R9,(int)((ulong)lVar1 >> 0x20),(int)lVar1,
                      (JDIMENSION)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    local_4c = 1;
    *(undefined4 *)(lVar1 + 0x48) = 0;
  }
  *(uint *)in_R9 = local_4c + *(int *)in_R9;
  *(uint *)(lVar1 + 0x50) = *(int *)(lVar1 + 0x50) - local_4c;
  if (*(int *)(lVar1 + 0x48) == 0) {
    *in_RDX = *in_RDX + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
merged_2v_upsample(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                   JDIMENSION *in_row_group_ctr,
                   JDIMENSION in_row_groups_avail, JSAMPARRAY output_buf,
                   JDIMENSION *out_row_ctr, JDIMENSION out_rows_avail)
/* 2:1 vertical sampling case: may need a spare row. */
{
  my_merged_upsample_ptr upsample = (my_merged_upsample_ptr)cinfo->upsample;
  JSAMPROW work_ptrs[2];
  JDIMENSION num_rows;          /* number of rows returned to caller */

  if (upsample->spare_full) {
    /* If we have a spare row saved from a previous cycle, just return it. */
    JDIMENSION size = upsample->out_row_width;
    if (cinfo->out_color_space == JCS_RGB565)
      size = cinfo->output_width * 2;
    jcopy_sample_rows(&upsample->spare_row, 0, output_buf + *out_row_ctr, 0, 1,
                      size);
    num_rows = 1;
    upsample->spare_full = FALSE;
  } else {
    /* Figure number of rows to return to caller. */
    num_rows = 2;
    /* Not more than the distance to the end of the image. */
    if (num_rows > upsample->rows_to_go)
      num_rows = upsample->rows_to_go;
    /* And not more than what the client can accept: */
    out_rows_avail -= *out_row_ctr;
    if (num_rows > out_rows_avail)
      num_rows = out_rows_avail;
    /* Create output pointer array for upsampler. */
    work_ptrs[0] = output_buf[*out_row_ctr];
    if (num_rows > 1) {
      work_ptrs[1] = output_buf[*out_row_ctr + 1];
    } else {
      work_ptrs[1] = upsample->spare_row;
      upsample->spare_full = TRUE;
    }
    /* Now do the upsampling. */
    (*upsample->upmethod) (cinfo, input_buf, *in_row_group_ctr, work_ptrs);
  }

  /* Adjust counts */
  *out_row_ctr += num_rows;
  upsample->rows_to_go -= num_rows;
  /* When the buffer is emptied, declare this input row group consumed */
  if (!upsample->spare_full)
    (*in_row_group_ctr)++;
}